

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O2

double gauss_newton(double *rgb,double *coeffs,int it)

{
  undefined1 auVar1 [16];
  int j;
  int iVar2;
  long lVar3;
  ostream *poVar4;
  runtime_error *this;
  uint uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double *J [3];
  double x [3];
  double residual [3];
  int P [4];
  double J2 [3];
  double J1 [3];
  double J0 [3];
  
  auVar8 = ZEXT864(0) << 0x40;
  uVar5 = 0;
  do {
    auVar7 = auVar8._0_16_;
    if (uVar5 == (~(it >> 0x1f) & it)) break;
    J[0] = J0;
    J[1] = J1;
    J[2] = J2;
    eval_residual(coeffs,rgb,residual);
    eval_jacobian(coeffs,rgb,J);
    iVar2 = LUPDecompose(J,3,1e-15,P);
    if (iVar2 == 0) {
      std::operator<<((ostream *)&std::cout,"RGB ");
      poVar4 = std::ostream::_M_insert<double>(*rgb);
      std::operator<<(poVar4," ");
      poVar4 = std::ostream::_M_insert<double>(rgb[1]);
      std::operator<<(poVar4," ");
      poVar4 = std::ostream::_M_insert<double>(rgb[2]);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::operator<<((ostream *)&std::cout,"-> ");
      poVar4 = std::ostream::_M_insert<double>(*coeffs);
      std::operator<<(poVar4," ");
      poVar4 = std::ostream::_M_insert<double>(coeffs[1]);
      std::operator<<(poVar4," ");
      poVar4 = std::ostream::_M_insert<double>(coeffs[2]);
      std::endl<char,std::char_traits<char>>(poVar4);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"LU decomposition failed!");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    LUPSolve(J,P,residual,3,x);
    auVar7 = ZEXT816(0) << 0x40;
    lVar3 = 0;
    while (auVar8 = ZEXT1664(auVar7), lVar3 != 3) {
      coeffs[lVar3] = coeffs[lVar3] - x[lVar3];
      auVar9._8_8_ = 0;
      auVar9._0_8_ = residual[lVar3];
      lVar3 = lVar3 + 1;
      auVar7 = vfmadd231sd_fma(auVar7,auVar9,auVar9);
    }
    auVar10._8_8_ = 0;
    auVar10._0_8_ = coeffs[1];
    auVar11._8_8_ = 0;
    auVar11._0_8_ = coeffs[2];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *coeffs;
    auVar1 = vmaxsd_avx(auVar10,auVar1);
    auVar1 = vmaxsd_avx(auVar11,auVar1);
    if (200.0 < auVar1._0_8_) {
      for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
        coeffs[lVar3] = (200.0 / auVar1._0_8_) * coeffs[lVar3];
      }
    }
    uVar5 = uVar5 + 1;
  } while (1e-06 <= auVar7._0_8_);
  if (auVar7._0_8_ < 0.0) {
    dVar6 = sqrt(auVar7._0_8_);
  }
  else {
    auVar7 = vsqrtsd_avx(auVar7,auVar7);
    dVar6 = auVar7._0_8_;
  }
  return dVar6;
}

Assistant:

double gauss_newton(const double rgb[3], double coeffs[3], int it = 15) {
    double r = 0;
    for (int i = 0; i < it; ++i) {
        double J0[3], J1[3], J2[3], *J[3] = {J0, J1, J2};

        double residual[3];

        eval_residual(coeffs, rgb, residual);
        eval_jacobian(coeffs, rgb, J);

        int P[4];
        int rv = LUPDecompose(J, 3, 1e-15, P);
        if (rv != 1) {
            std::cout << "RGB " << rgb[0] << " " << rgb[1] << " " << rgb[2] << std::endl;
            std::cout << "-> " << coeffs[0] << " " << coeffs[1] << " " << coeffs[2]
                      << std::endl;
            throw std::runtime_error("LU decomposition failed!");
        }

        double x[3];
        LUPSolve(J, P, residual, 3, x);

        r = 0.0;
        for (int j = 0; j < 3; ++j) {
            coeffs[j] -= x[j];
            r += residual[j] * residual[j];
        }
        double max = std::max(std::max(coeffs[0], coeffs[1]), coeffs[2]);

        if (max > 200) {
            for (int j = 0; j < 3; ++j)
                coeffs[j] *= 200 / max;
        }

        if (r < 1e-6)
            break;
    }
    return std::sqrt(r);
}